

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

bool operator==(Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *x,Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *y)

{
  size_t __n;
  int iVar1;
  
  if ((x->a == y->a) && (__n = (x->_b)._M_string_length, __n == (y->_b)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((x->_b)._M_dataplus._M_p,(y->_b)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==(const Pair& x, const Pair& y)
  {
    return x.a == y.a && x._b == y._b;
  }